

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int32 iVar1;
  int iVar2;
  cmd_ln_t *pcVar3;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  model_def_t *local_18;
  
  parse_cmd_ln(argc,argv);
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-sigfig");
  uVar6 = 0;
  sprintf(e_fmt,"%%.%de ",(ulong)((int)lVar4 - 1));
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-sigfig");
  sprintf(e_fmt_ld_sp," %%.%de",(ulong)((int)lVar4 - 1));
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-moddeffn");
  if (pcVar5 != (char *)0x0) {
    iVar1 = model_def_read(&local_18,pcVar5);
    if (iVar1 != 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
              ,499,"Problems reading model definition file %s\n",pcVar5);
    }
  }
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-mixwfn");
  if (pcVar5 != (char *)0x0) {
    iVar2 = print_mixw(pcVar5);
    uVar6 = -(uint)(iVar2 != 0);
  }
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-tmatfn");
  if (pcVar5 != (char *)0x0) {
    iVar2 = print_tmat(pcVar5);
    uVar6 = uVar6 | -(uint)(iVar2 != 0);
  }
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-gaufn");
  if (pcVar5 != (char *)0x0) {
    iVar2 = print_gau(pcVar5);
    uVar6 = uVar6 | -(uint)(iVar2 != 0);
  }
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-fullgaufn");
  if (pcVar5 != (char *)0x0) {
    iVar2 = print_full_gau(pcVar5);
    uVar6 = uVar6 | -(uint)(iVar2 != 0);
  }
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-gaucntfn");
  if (pcVar5 != (char *)0x0) {
    iVar2 = print_gau_cnt(pcVar5);
    uVar6 = uVar6 | -(uint)(iVar2 != 0);
  }
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-regmatcntfn");
  if (pcVar5 != (char *)0x0) {
    iVar2 = print_regmat_cnt(pcVar5);
    uVar6 = uVar6 | -(uint)(iVar2 != 0);
  }
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-lambdafn");
  if (pcVar5 != (char *)0x0) {
    pcVar3 = cmd_ln_get();
    dVar7 = cmd_ln_float_r(pcVar3,"-lambdamin");
    pcVar3 = cmd_ln_get();
    dVar8 = cmd_ln_float_r(pcVar3,"-lambdamax");
    iVar2 = print_lambda(pcVar5,(float32)(float)dVar7,(float32)(float)dVar8);
    uVar6 = uVar6 | -(uint)(iVar2 != 0);
  }
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-lda");
  if (pcVar5 != (char *)0x0) {
    iVar2 = print_lda(pcVar5);
    uVar6 = uVar6 | -(uint)(iVar2 != 0);
  }
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-ts2cbfn");
  if (pcVar5 == (char *)0x0) {
    if (uVar6 != 0) goto LAB_00103910;
  }
  else {
    iVar2 = print_ts2cb(pcVar5);
    if (iVar2 != 0 || uVar6 != 0) {
LAB_00103910:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
              ,0x226,
              "Please specify input by either -tmatfn, -mixwfn, -gaufn, -gaucntfn, -regmatcntfn, -lda, -ts2cbfn or -lambdafn\n"
             );
      exit(1);
    }
  }
  return 0;
}

Assistant:

static int
initialize(int argc,
	   char *argv[])
{
    /* define, parse and (partially) validate the command line */
    parse_cmd_ln(argc, argv);

    sprintf(e_fmt, "%%.%de ", cmd_ln_int32("-sigfig") - 1);
    sprintf(e_fmt_ld_sp, " %%.%de", cmd_ln_int32("-sigfig") - 1);
    
    return S3_SUCCESS;
}